

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_do(connectdata *conn,_Bool *done)

{
  ftp_conn *ftpc;
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  *done = false;
  (conn->proto).ftpc.wait_data_conn = false;
  if (((conn->data->state).wildcardmatch & 1U) == 0) {
    conn_local._4_4_ = ftp_parse_url_path(conn);
  }
  else {
    conn_local._4_4_ = wc_statemach(conn);
    if (((conn->data->wildcard).state == CURLWC_SKIP) ||
       ((conn->data->wildcard).state == CURLWC_DONE)) {
      return CURLE_OK;
    }
  }
  if (conn_local._4_4_ == CURLE_OK) {
    conn_local._4_4_ = ftp_regular_transfer(conn,done);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ftp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(conn->data->state.wildcardmatch) {
    result = wc_statemach(conn);
    if(conn->data->wildcard.state == CURLWC_SKIP ||
      conn->data->wildcard.state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(conn);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(conn, done);

  return result;
}